

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.hpp
# Opt level: O0

Phys * __thiscall OPNMIDIplay::MIDIchannel::NoteInfo::phys_find(NoteInfo *this,uint chip_chan)

{
  uint local_24;
  Phys *pPStack_20;
  uint i;
  Phys *ph;
  uint chip_chan_local;
  NoteInfo *this_local;
  
  pPStack_20 = (Phys *)0x0;
  for (local_24 = 0; local_24 < this->chip_channels_count && pPStack_20 == (Phys *)0x0;
      local_24 = local_24 + 1) {
    if (this->chip_channels[local_24].chip_chan == chip_chan) {
      pPStack_20 = this->chip_channels + local_24;
    }
  }
  return pPStack_20;
}

Assistant:

Phys *phys_find(unsigned chip_chan)
            {
                Phys *ph = NULL;
                for(unsigned i = 0; i < chip_channels_count && !ph; ++i)
                    if(chip_channels[i].chip_chan == chip_chan)
                        ph = &chip_channels[i];
                return ph;
            }